

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O2

void __thiscall
JsrtDebugManager::CallDebugEventCallback
          (JsrtDebugManager *this,JsDiagDebugEvent debugEvent,DynamicObject *eventDataObject,
          ScriptContext *scriptContext,bool isBreak)

{
  bool bVar1;
  ThreadContext *pTVar2;
  void *__frameAddr;
  undefined1 local_78 [8];
  LeaveScriptObject<true,_true,_false> __leaveScriptObject;
  DynamicObject *eventDataObject_local;
  anon_class_32_4_c0da80a4 funcPtr;
  JsDiagDebugEvent debugEvent_local;
  bool isBreak_local;
  
  funcPtr.this = (JsrtDebugManager *)&funcPtr.eventDataObject;
  funcPtr.debugEvent = &__leaveScriptObject.__exceptionCheck.handledExceptionType;
  eventDataObject_local = (DynamicObject *)((long)&funcPtr.eventDataObject + 7);
  __leaveScriptObject._32_8_ = eventDataObject;
  funcPtr.isBreak = (bool *)this;
  funcPtr.eventDataObject._0_4_ = debugEvent;
  funcPtr.eventDataObject._7_1_ = isBreak;
  if (scriptContext->threadContext->isScriptActive == true) {
    Js::LeaveScriptObject<true,_true,_false>::LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)local_78,scriptContext,
               &stack0xfffffffffffffff8);
    pTVar2 = scriptContext->threadContext;
    bVar1 = pTVar2->reentrancySafeOrHandled;
    pTVar2->reentrancySafeOrHandled = true;
    CallDebugEventCallback::anon_class_32_4_c0da80a4::operator()
              ((anon_class_32_4_c0da80a4 *)&eventDataObject_local);
    ThreadContext::DisposeOnLeaveScript(scriptContext->threadContext);
    pTVar2->reentrancySafeOrHandled = bVar1;
    Js::LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)local_78);
  }
  else {
    CallDebugEventCallback::anon_class_32_4_c0da80a4::operator()
              ((anon_class_32_4_c0da80a4 *)&eventDataObject_local);
  }
  return;
}

Assistant:

void JsrtDebugManager::CallDebugEventCallback(JsDiagDebugEvent debugEvent, Js::DynamicObject* eventDataObject, Js::ScriptContext* scriptContext, bool isBreak)
{
    class AutoClear
    {
    public:
        AutoClear(JsrtDebugManager* jsrtDebug, void* dispatchHaltFrameAddress)
        {
            this->jsrtDebugManager = jsrtDebug;
            this->jsrtDebugManager->GetThreadContext()->GetDebugManager()->SetDispatchHaltFrameAddress(dispatchHaltFrameAddress);
        }

        ~AutoClear()
        {
            if (jsrtDebugManager->debuggerObjectsManager != nullptr)
            {
                jsrtDebugManager->GetDebuggerObjectsManager()->ClearAll();
            }

            if (jsrtDebugManager->stackFrames != nullptr)
            {
                Adelete(jsrtDebugManager->GetDebugObjectArena(), jsrtDebugManager->stackFrames);
                jsrtDebugManager->stackFrames = nullptr;
            }
            this->jsrtDebugManager->GetThreadContext()->GetDebugManager()->SetDispatchHaltFrameAddress(nullptr);
            this->jsrtDebugManager = nullptr;
        }
    private:
        JsrtDebugManager* jsrtDebugManager;
    };

    auto funcPtr = [&]()
    {
        if (isBreak)
        {
            void *frameAddress = _AddressOfReturnAddress();
            // If we are reporting break we should clear all objects after call returns

            // Save the frame address, when asking for stack we will only give stack which is under this address
            // because host can execute javascript after break which should not be part of stack.
            AutoClear autoClear(this, frameAddress);
            this->debugEventCallback(debugEvent, eventDataObject, this->callbackState);
        }
        else
        {
            this->debugEventCallback(debugEvent, eventDataObject, this->callbackState);
        }
    };

    if (scriptContext->GetThreadContext()->IsScriptActive())
    {
        BEGIN_LEAVE_SCRIPT(scriptContext)
        {
            funcPtr();
        }
        END_LEAVE_SCRIPT(scriptContext);
    }
    else
    {
        funcPtr();
    }
}